

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprMemoryLiteral *
CreateConstruct(ExpressionEvalContext *ctx,TypeBase *type,ExprBase *el0,ExprBase *el1,ExprBase *el2)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ExprPointerLiteral *pEVar6;
  undefined4 extraout_var;
  uint offset;
  ExprMemoryLiteral *memory;
  
  if (el0 == (ExprBase *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = el0->type->size;
  }
  if (el1 != (ExprBase *)0x0) {
    lVar5 = lVar5 + el1->type->size;
  }
  if (el2 != (ExprBase *)0x0) {
    lVar5 = lVar5 + el2->type->size;
  }
  if (type->size != lVar5) {
    __assert_fail("type->size == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x1bd,
                  "ExprMemoryLiteral *CreateConstruct(ExpressionEvalContext &, TypeBase *, ExprBase *, ExprBase *, ExprBase *)"
                 );
  }
  pEVar6 = AllocateTypeStorage(ctx,el0->source,type);
  if (pEVar6 != (ExprPointerLiteral *)0x0) {
    pAVar1 = ctx->ctx->allocator;
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var,iVar4);
    pSVar2 = el0->source;
    (memory->super_ExprBase).typeID = 0xd;
    (memory->super_ExprBase).source = pSVar2;
    (memory->super_ExprBase).type = type;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223640;
    memory->ptr = pEVar6;
    bVar3 = CreateInsert(ctx,memory,0,el0);
    if (bVar3) {
      offset = (uint)el0->type->size;
      if (el1 != (ExprBase *)0x0) {
        bVar3 = CreateInsert(ctx,memory,offset,el1);
        if (!bVar3) {
          return (ExprMemoryLiteral *)0x0;
        }
        offset = offset + (int)el1->type->size;
      }
      if (el2 != (ExprBase *)0x0) {
        bVar3 = CreateInsert(ctx,memory,offset,el2);
        if (!bVar3) {
          return (ExprMemoryLiteral *)0x0;
        }
        return memory;
      }
      return memory;
    }
  }
  return (ExprMemoryLiteral *)0x0;
}

Assistant:

ExprMemoryLiteral* CreateConstruct(ExpressionEvalContext &ctx, TypeBase *type, ExprBase *el0, ExprBase *el1, ExprBase *el2)
{
	long long size = 0;
	
	if(el0)
		size += el0->type->size;

	if(el1)
		size += el1->type->size;

	if(el2)
		size += el2->type->size;

	assert(type->size == size);

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, el0->source, type);

	if(!storage)
		return NULL;

	ExprMemoryLiteral *memory = new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(el0->source, type, storage);

	unsigned offset = 0;

	if(el0 && !CreateInsert(ctx, memory, offset, el0))
		return NULL;
	else if(el0)
		offset += unsigned(el0->type->size);

	if(el1 && !CreateInsert(ctx, memory, offset, el1))
		return NULL;
	else if(el1)
		offset += unsigned(el1->type->size);

	if(el2 && !CreateInsert(ctx, memory, offset, el2))
		return NULL;
	else if(el2)
		offset += unsigned(el2->type->size);

	return memory;
}